

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

bool __thiscall inja::Parser::parse_expression_datum(Parser *this,Template *tmpl)

{
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string_view<char,_std::char_traits<char>_> lhs_01;
  string_view name;
  string_view name_00;
  bool bVar1;
  reference __a;
  reference __b;
  const_pointer s;
  const_pointer pcVar2;
  const_pointer pcVar3;
  size_type sVar4;
  string_view *this_00;
  bool local_4d1;
  Flag local_494;
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  local_490;
  input_adapter local_470;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_460;
  Op local_449;
  undefined1 local_448 [8];
  string_view json_text;
  string local_430;
  allocator local_409;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  allocator local_391;
  string local_390;
  allocator local_369;
  string local_368;
  allocator local_341;
  string local_340;
  allocator local_319;
  string local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  allocator local_291;
  string local_290;
  Flag local_270;
  Op local_269;
  type local_268;
  const_pointer local_258;
  size_type local_250;
  type local_248;
  const_pointer local_238;
  size_type local_230;
  type local_228;
  const_pointer local_218;
  size_type local_210;
  undefined1 local_208 [24];
  reverse_iterator<__gnu_cxx::__normal_iterator<inja::Bytecode_*,_std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>_>_>
  local_1f0;
  Token local_1e8;
  undefined1 local_1d0 [7];
  Op op;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  allocator local_169;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator local_e1;
  string local_e0;
  uint local_bc;
  undefined8 uStack_b8;
  uint num_args;
  Token func_token;
  string local_98;
  allocator local_61;
  string local_60;
  long local_40;
  size_t brace_level;
  size_t bracket_level;
  string_view json_first;
  Template *tmpl_local;
  Parser *this_local;
  
  json_first.size_ = (size_type)tmpl;
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&bracket_level);
  brace_level = 0;
  local_40 = 0;
  do {
    switch((this->m_tok).kind) {
    case Id:
      get_peek_token(this);
      if ((this->m_peek_tok).kind == LeftParen) {
        uStack_b8 = *(undefined8 *)&this->m_tok;
        func_token._0_8_ = (this->m_tok).text.data_;
        func_token.text.data_ = (const_pointer)(this->m_tok).text.size_;
        get_next_token(this);
        get_next_token(this);
        local_bc = 0;
        if ((this->m_tok).kind == RightParen) {
          get_next_token(this);
        }
        else {
          while( true ) {
            bVar1 = parse_expression(this,(Template *)json_first.size_);
            if (!bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_e0,"parser_error",&local_e1);
              Token::describe_abi_cxx11_(&local_148,&this->m_tok);
              std::operator+(&local_128,"expected expression, got \'",&local_148);
              std::operator+(&local_108,&local_128,"\'");
              inja_throw(&local_e0,&local_108);
              std::__cxx11::string::~string((string *)&local_108);
              std::__cxx11::string::~string((string *)&local_128);
              std::__cxx11::string::~string((string *)&local_148);
              std::__cxx11::string::~string((string *)&local_e0);
              std::allocator<char>::~allocator((allocator<char> *)&local_e1);
            }
            local_bc = local_bc + 1;
            if ((this->m_tok).kind == RightParen) break;
            if ((this->m_tok).kind != Comma) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_168,"parser_error",&local_169);
              Token::describe_abi_cxx11_((string *)local_1d0,&this->m_tok);
              std::operator+(&local_1b0,"expected \')\' or \',\', got \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1d0);
              std::operator+(&local_190,&local_1b0,"\'");
              inja_throw(&local_168,&local_190);
              std::__cxx11::string::~string((string *)&local_190);
              std::__cxx11::string::~string((string *)&local_1b0);
              std::__cxx11::string::~string((string *)local_1d0);
              std::__cxx11::string::~string((string *)&local_168);
              std::allocator<char>::~allocator((allocator<char> *)&local_169);
            }
            get_next_token(this);
          }
          get_next_token(this);
        }
        local_1e8.kind = func_token.kind;
        local_1e8._4_4_ = func_token._4_4_;
        local_1e8.text.data_ = func_token.text.data_;
        name_00.size_ = (size_type)func_token.text.data_;
        name_00.data_ = (const_pointer)func_token._0_8_;
        local_1e8.text.size_._7_1_ =
             FunctionStorage::find_builtin(&this->m_static->functions,name_00,local_bc);
        if (local_1e8.text.size_._7_1_ != Nop) {
          if (local_1e8.text.size_._7_1_ == Default) {
            __a = std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::back
                            ((vector<inja::Bytecode,_std::allocator<inja::Bytecode>_> *)
                             json_first.size_);
            std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::rbegin
                      ((vector<inja::Bytecode,_std::allocator<inja::Bytecode>_> *)(local_208 + 0x10)
                      );
            std::
            reverse_iterator<__gnu_cxx::__normal_iterator<inja::Bytecode_*,_std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>_>_>
            ::operator+(&local_1f0,(difference_type)(local_208 + 0x10));
            __b = std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<inja::Bytecode_*,_std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>_>_>
                  ::operator*(&local_1f0);
            std::swap<inja::Bytecode>(__a,__b);
          }
          append_function(this,(Template *)json_first.size_,local_1e8.text.size_._7_1_,local_bc);
          return true;
        }
        local_208._0_8_ = func_token._0_8_;
        local_208._8_8_ = func_token.text.data_;
        name.size_ = (size_type)func_token.text.data_;
        name.data_ = (const_pointer)func_token._0_8_;
        append_callback(this,(Template *)json_first.size_,name,local_bc);
        return true;
      }
      local_218 = (this->m_tok).text.data_;
      local_210 = (this->m_tok).text.size_;
      nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_228,"true");
      lhs_01.size_ = local_210;
      lhs_01.data_ = local_218;
      bVar1 = nonstd::sv_lite::operator==(lhs_01,local_228);
      local_4d1 = true;
      if (!bVar1) {
        local_238 = (this->m_tok).text.data_;
        local_230 = (this->m_tok).text.size_;
        nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_248,"false");
        lhs_00.size_ = local_230;
        lhs_00.data_ = local_238;
        bVar1 = nonstd::sv_lite::operator==(lhs_00,local_248);
        local_4d1 = true;
        if (!bVar1) {
          local_258 = (this->m_tok).text.data_;
          local_250 = (this->m_tok).text.size_;
          nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_268,"null");
          lhs.size_ = local_250;
          lhs.data_ = local_258;
          local_4d1 = nonstd::sv_lite::operator==(lhs,local_268);
        }
      }
      if (local_4d1 == false) {
        local_269 = Push;
        local_270 = ValueLookupDot;
        if (this->m_config->notation == Pointer) {
          local_270 = ValueLookupPointer;
        }
        std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
        emplace_back<inja::Bytecode::Op,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>&,inja::Bytecode::Flag>
                  ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)json_first.size_,
                   &local_269,&(this->m_tok).text,&local_270);
        get_next_token(this);
        return true;
      }
      if ((local_40 == 0) && (brace_level == 0)) {
        bracket_level = (size_t)(this->m_tok).text.data_;
        json_first.data_ = (const_pointer)(this->m_tok).text.size_;
        goto LAB_001b25c6;
      }
      break;
    case Number:
    case String:
      if ((local_40 == 0) && (brace_level == 0)) {
        bracket_level = (size_t)(this->m_tok).text.data_;
        json_first.data_ = (const_pointer)(this->m_tok).text.size_;
        goto LAB_001b25c6;
      }
      break;
    case Comma:
    case Colon:
      if ((local_40 == 0) && (brace_level == 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_290,"parser_error",&local_291);
        Token::describe_abi_cxx11_(&local_2f8,&this->m_tok);
        std::operator+(&local_2d8,"unexpected token \'",&local_2f8);
        std::operator+(&local_2b8,&local_2d8,"\'");
        inja_throw(&local_290,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_290);
        std::allocator<char>::~allocator((allocator<char> *)&local_291);
      }
      break;
    case LeftParen:
      get_next_token(this);
      bVar1 = parse_expression(this,(Template *)json_first.size_);
      if (bVar1) {
        if ((this->m_tok).kind != RightParen) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_60,"parser_error",&local_61);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_98,"unmatched \'(\'",
                     (allocator *)((long)&func_token.text.size_ + 7));
          inja_throw(&local_60,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::allocator<char>::~allocator((allocator<char> *)((long)&func_token.text.size_ + 7));
          std::__cxx11::string::~string((string *)&local_60);
          std::allocator<char>::~allocator((allocator<char> *)&local_61);
        }
        get_next_token(this);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      return this_local._7_1_;
    default:
      if (local_40 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3b8,"parser_error",&local_3b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3e0,"unmatched \'{\'",&local_3e1);
        inja_throw(&local_3b8,&local_3e0);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
      }
      if (brace_level != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_408,"parser_error",&local_409);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_430,"unmatched \'[\'",(allocator *)((long)&json_text.size_ + 7))
        ;
        inja_throw(&local_408,&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        std::allocator<char>::~allocator((allocator<char> *)((long)&json_text.size_ + 7));
        std::__cxx11::string::~string((string *)&local_408);
        std::allocator<char>::~allocator((allocator<char> *)&local_409);
      }
      return false;
    case LeftBracket:
      if ((local_40 == 0) && (brace_level == 0)) {
        bracket_level = (size_t)(this->m_tok).text.data_;
        json_first.data_ = (const_pointer)(this->m_tok).text.size_;
      }
      brace_level = brace_level + 1;
      break;
    case RightBracket:
      if (brace_level == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_318,"parser_error",&local_319);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_340,"unexpected \']\'",&local_341);
        inja_throw(&local_318,&local_340);
        std::__cxx11::string::~string((string *)&local_340);
        std::allocator<char>::~allocator((allocator<char> *)&local_341);
        std::__cxx11::string::~string((string *)&local_318);
        std::allocator<char>::~allocator((allocator<char> *)&local_319);
      }
      brace_level = brace_level - 1;
      goto joined_r0x001b237f;
    case LeftBrace:
      if ((local_40 == 0) && (brace_level == 0)) {
        bracket_level = (size_t)(this->m_tok).text.data_;
        json_first.data_ = (const_pointer)(this->m_tok).text.size_;
      }
      local_40 = local_40 + 1;
      break;
    case RightBrace:
      if (local_40 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_368,"parser_error",&local_369);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_390,"unexpected \'}\'",&local_391);
        inja_throw(&local_368,&local_390);
        std::__cxx11::string::~string((string *)&local_390);
        std::allocator<char>::~allocator((allocator<char> *)&local_391);
        std::__cxx11::string::~string((string *)&local_368);
        std::allocator<char>::~allocator((allocator<char> *)&local_369);
      }
      local_40 = local_40 + -1;
joined_r0x001b237f:
      if ((local_40 == 0) && (brace_level == 0)) {
LAB_001b25c6:
        s = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)&bracket_level);
        this_00 = &(this->m_tok).text;
        pcVar2 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data(this_00);
        pcVar3 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)&bracket_level);
        sVar4 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size(this_00);
        nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_448,s,
                   (size_type)(pcVar2 + (sVar4 - (long)pcVar3)));
        sVar4 = json_first.size_;
        local_449 = Push;
        nlohmann::detail::input_adapter::
        input_adapter<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_0>
                  (&local_470,(basic_string_view<char,_std::char_traits<char>_> *)local_448);
        std::
        function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
        ::function(&local_490,(nullptr_t)0x0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::parse(&local_460,&local_470,&local_490,true);
        local_494 = ValueImmediate;
        std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
        emplace_back<inja::Bytecode::Op,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,inja::Bytecode::Flag>
                  ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)sVar4,&local_449,
                   &local_460,&local_494);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&local_460);
        std::
        function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
        ::~function(&local_490);
        nlohmann::detail::input_adapter::~input_adapter(&local_470);
        get_next_token(this);
        return true;
      }
    }
    get_next_token(this);
  } while( true );
}

Assistant:

bool parse_expression_datum(Template& tmpl) {
		nonstd::string_view json_first;
		size_t bracket_level = 0;
		size_t brace_level = 0;

		for (;;) {
			switch (m_tok.kind) {
				case Token::Kind::LeftParen: {
					get_next_token();
					if (!parse_expression(tmpl)) return false;
					if (m_tok.kind != Token::Kind::RightParen) {
						inja_throw("parser_error", "unmatched '('");
					}
					get_next_token();
					return true;
				}
				case Token::Kind::Id:
					get_peek_token();
					if (m_peek_tok.kind == Token::Kind::LeftParen) {
						// function call, parse arguments
						Token func_token = m_tok;
						get_next_token();  // id
						get_next_token();  // leftParen
						unsigned int num_args = 0;
						if (m_tok.kind == Token::Kind::RightParen) {
							// no args
							get_next_token();
						} else {
							for (;;) {
								if (!parse_expression(tmpl)) {
									inja_throw("parser_error", "expected expression, got '" + m_tok.describe() + "'");
								}
								num_args += 1;
								if (m_tok.kind == Token::Kind::RightParen) {
									get_next_token();
									break;
								}
								if (m_tok.kind != Token::Kind::Comma) {
									inja_throw("parser_error", "expected ')' or ',', got '" + m_tok.describe() + "'");
								}
								get_next_token();
							}
						}

						auto op = m_static.functions.find_builtin(func_token.text, num_args);

						if (op != Bytecode::Op::Nop) {
							// swap arguments for default(); see comment in RenderTo()
							if (op == Bytecode::Op::Default)
								std::swap(tmpl.bytecodes.back(), *(tmpl.bytecodes.rbegin() + 1));
							append_function(tmpl, op, num_args);
							return true;
						} else {
							append_callback(tmpl, func_token.text, num_args);
							return true;
						}
					} else if (m_tok.text == "true" || m_tok.text == "false" || m_tok.text == "null") {
						// true, false, null are json literals
						if (brace_level == 0 && bracket_level == 0) {
							json_first = m_tok.text;
							goto returnJson;
						}
						break;
					} else {
						// normal literal (json read)
						tmpl.bytecodes.emplace_back(Bytecode::Op::Push, m_tok.text,
													m_config.notation == ElementNotation::Pointer
														? Bytecode::Flag::ValueLookupPointer
														: Bytecode::Flag::ValueLookupDot);
						get_next_token();
						return true;
					}
				// json passthrough
				case Token::Kind::Number:
				case Token::Kind::String:
					if (brace_level == 0 && bracket_level == 0) {
						json_first = m_tok.text;
						goto returnJson;
					}
					break;
				case Token::Kind::Comma:
				case Token::Kind::Colon:
					if (brace_level == 0 && bracket_level == 0) {
						inja_throw("parser_error", "unexpected token '" + m_tok.describe() + "'");
					}
					break;
				case Token::Kind::LeftBracket:
					if (brace_level == 0 && bracket_level == 0) {
						json_first = m_tok.text;
					}
					bracket_level += 1;
					break;
				case Token::Kind::LeftBrace:
					if (brace_level == 0 && bracket_level == 0) {
						json_first = m_tok.text;
					}
					brace_level += 1;
					break;
				case Token::Kind::RightBracket:
					if (bracket_level == 0) {
						inja_throw("parser_error", "unexpected ']'");
					}
					--bracket_level;
					if (brace_level == 0 && bracket_level == 0) goto returnJson;
					break;
				case Token::Kind::RightBrace:
					if (brace_level == 0) {
						inja_throw("parser_error", "unexpected '}'");
					}
					--brace_level;
					if (brace_level == 0 && bracket_level == 0) goto returnJson;
					break;
				default:
					if (brace_level != 0) {
						inja_throw("parser_error", "unmatched '{'");
					}
					if (bracket_level != 0) {
						inja_throw("parser_error", "unmatched '['");
					}
					return false;
			}

			get_next_token();
		}

	returnJson:
		// bridge across all intermediate tokens
		nonstd::string_view json_text(json_first.data(), m_tok.text.data() - json_first.data() + m_tok.text.size());
		tmpl.bytecodes.emplace_back(Bytecode::Op::Push, json::parse(json_text), Bytecode::Flag::ValueImmediate);
		get_next_token();
		return true;
	}